

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFastMap.c
# Opt level: O1

int Ivy_FastMapArea(Ivy_Man_t *pAig)

{
  Vec_Vec_t *vLuts;
  void **ppvVar1;
  int *piVar2;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  
  vLuts = *(Vec_Vec_t **)((long)pAig->pData + 0x18);
  iVar7 = vLuts->nSize;
  if (0 < (long)iVar7) {
    ppvVar1 = vLuts->pArray;
    lVar5 = 0;
    do {
      *(undefined4 *)((long)ppvVar1[lVar5] + 4) = 0;
      lVar5 = lVar5 + 1;
    } while (iVar7 != lVar5);
  }
  pVVar4 = pAig->vPos;
  if (pVVar4->nSize < 1) {
    iVar7 = 0;
  }
  else {
    lVar5 = 0;
    iVar7 = 0;
    do {
      iVar3 = Ivy_FastMapArea_rec(pAig,(Ivy_Obj_t *)
                                       (*(ulong *)((long)pVVar4->pArray[lVar5] + 0x10) &
                                       0xfffffffffffffffe),vLuts);
      iVar7 = iVar7 + iVar3;
      lVar5 = lVar5 + 1;
      pVVar4 = pAig->vPos;
    } while (lVar5 < pVVar4->nSize);
  }
  lVar5 = (long)pAig->vObjs->nSize;
  if (0 < lVar5) {
    ppvVar1 = pAig->vObjs->pArray;
    lVar6 = 0;
    do {
      piVar2 = (int *)ppvVar1[lVar6];
      if ((piVar2 != (int *)0x0) && (0xfffffffd < (piVar2[2] & 0xfU) - 7)) {
        *(undefined1 *)
         (*(long *)((long)pAig->pData + 0x10) + 1 +
         (long)*(int *)((long)pAig->pData + 8) * (long)*piVar2) = 0;
      }
      lVar6 = lVar6 + 1;
    } while (lVar5 != lVar6);
  }
  return iVar7;
}

Assistant:

int Ivy_FastMapArea( Ivy_Man_t * pAig )
{
    Vec_Vec_t * vLuts;
    Ivy_Obj_t * pObj;
    int i, Counter = 0;
    // get the array to store the nodes
    vLuts = ((Ivy_SuppMan_t *)pAig->pData)->vLuts;
    Vec_VecClear( vLuts );
    // explore starting from each node
    Ivy_ManForEachPo( pAig, pObj, i )
        Counter += Ivy_FastMapArea_rec( pAig, Ivy_ObjFanin0(pObj), vLuts );
    // clean the marks
    Ivy_ManForEachNode( pAig, pObj, i )
        Ivy_ObjSupp( pAig, pObj )->fMark = 0;
    return Counter;
}